

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int parse_opt_open_file(int argc,char **argv)

{
  uint64_t __n;
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  char *__ptr;
  char local_418 [8];
  char filename [1024];
  
  do {
    iVar1 = getopt(argc,argv,(char *)0x0);
  } while ((char)iVar1 != -1);
  strcpy(local_418,argv[(long)argc + -1]);
  __stream = fopen(local_418,"rb");
  if (__stream == (FILE *)0x0) {
    __ptr = "Error open input file\n";
  }
  else {
    fseek(__stream,0,2);
    buf_size = ftell(__stream);
    fseek(__stream,0,0);
    __n = buf_size;
    buf = (uint8_t *)malloc((-(int)buf_size & 3) + buf_size);
    if (buf != (uint8_t *)0x0) {
      sVar2 = fread(buf,1,__n,__stream);
      if (__n == sVar2) {
        fclose(__stream);
        return 0;
      }
      goto LAB_00105f01;
    }
    __ptr = "Error malloc file buf\n";
  }
  fwrite(__ptr,0x16,1,_stderr);
LAB_00105f01:
  free(buf);
  fclose(__stream);
  return -1;
}

Assistant:

int parse_opt_open_file(int argc, char * const *argv)
{
    char filename[1024];
    char c;

    while((c = getopt(argc, argv, NULL)) != -1)
    {
        //to add options
    }
    strcpy(filename, argv[argc - 1]);

    FILE *input = fopen(filename, "rb");
    if(!input)
    {
        fprintf(stderr, "Error open input file\n");
        goto ERR;
    }
    fseek(input, 0, SEEK_END);
    buf_size = (uint64_t)ftell(input);
    fseek(input, 0, SEEK_SET);
    uint64_t malloc_size = buf_size;
    while(malloc_size % 4)
        malloc_size++;
    buf = (uint8_t *)malloc(sizeof(uint8_t) * malloc_size);
    if(!buf)
    {
        fprintf(stderr, "Error malloc file buf\n");
        goto ERR;
    }

    if(buf_size != fread(buf, 1, buf_size, input))
        goto ERR;
    fclose(input);
    return 0;
ERR:
    if(buf)
        free(buf);
    fclose(input);
    return -1;
}